

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O1

Type dg::vr::Relations::negated(Type type)

{
  if (type < PT) {
    return *(Type *)(&DAT_001020c0 + (ulong)type * 4);
  }
  abort();
}

Assistant:

Relations::Type Relations::negated(Type type) {
    switch (type) {
    case EQ:
        return NE;
    case NE:
        return EQ;
    case SLE:
        return SGT;
    case SLT:
        return SGE;
    case ULE:
        return UGT;
    case ULT:
        return UGE;
    case SGE:
        return SLT;
    case SGT:
        return SLE;
    case UGE:
        return ULT;
    case UGT:
        return ULE;
    case PT:
    case PF:
        break;
    }
    assert(0 && "no negation for relation");
    abort();
}